

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O0

int sat_solver3_addclause(sat_solver3 *s,lit *begin,lit *end)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  lit lVar4;
  int iVar5;
  int *begin_00;
  int local_5c;
  lit local_48;
  lit l;
  lit last;
  int maxvar;
  lit *j;
  lit *i;
  int fVerbose;
  lit *end_local;
  lit *begin_local;
  sat_solver3 *s_local;
  
  if (end <= begin) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                  ,0x6a8,"int sat_solver3_addclause(sat_solver3 *, lit *, lit *)");
  }
  veci_resize(&s->temp_clause,0);
  for (j = begin; j < end; j = j + 1) {
    veci_push(&s->temp_clause,*j);
  }
  begin_00 = veci_begin(&s->temp_clause);
  iVar2 = veci_size(&s->temp_clause);
  l = lit_var(*begin_00);
  j = begin_00;
  while (j = j + 1, j < begin_00 + iVar2) {
    lVar4 = *j;
    iVar3 = lit_var(lVar4);
    if (l < iVar3) {
      local_5c = lit_var(lVar4);
    }
    else {
      local_5c = l;
    }
    l = local_5c;
    _last = j;
    while( true ) {
      bVar1 = false;
      if (begin_00 < _last) {
        bVar1 = lVar4 < _last[-1];
      }
      if (!bVar1) break;
      *_last = _last[-1];
      _last = _last + -1;
    }
    *_last = lVar4;
  }
  sat_solver3_setnvars(s,l + 1);
  local_48 = -2;
  _last = begin_00;
  j = begin_00;
  while( true ) {
    if (begin_00 + iVar2 <= j) {
      if (_last == begin_00) {
        s_local._4_4_ = 0;
      }
      else if ((long)_last - (long)begin_00 >> 2 == 1) {
        s_local._4_4_ = sat_solver3_enqueue(s,*begin_00,0);
      }
      else {
        sat_solver3_clause_new(s,begin_00,_last,0);
        s_local._4_4_ = 1;
      }
      return s_local._4_4_;
    }
    iVar3 = *j;
    lVar4 = lit_neg(local_48);
    if (iVar3 == lVar4) break;
    iVar3 = lit_var(*j);
    iVar3 = var_value(s,iVar3);
    iVar5 = lit_sign(*j);
    if (iVar3 == iVar5) {
      return 1;
    }
    if (*j != local_48) {
      iVar3 = lit_var(*j);
      iVar3 = var_value(s,iVar3);
      if (iVar3 == 3) {
        local_48 = *j;
        *_last = local_48;
        _last = _last + 1;
      }
    }
    j = j + 1;
  }
  return 1;
}

Assistant:

int sat_solver3_addclause(sat_solver3* s, lit* begin, lit* end)
{
    int fVerbose = 0;
    lit *i,*j;
    int maxvar;
    lit last;
    assert( begin < end );
    if ( fVerbose )
    {
        for ( i = begin; i < end; i++ )
            printf( "%s%d ", (*i)&1 ? "!":"", (*i)>>1 );
        printf( "\n" );
    }

    veci_resize( &s->temp_clause, 0 );
    for ( i = begin; i < end; i++ )
        veci_push( &s->temp_clause, *i );
    begin = veci_begin( &s->temp_clause );
    end = begin + veci_size( &s->temp_clause );

    // insertion sort
    maxvar = lit_var(*begin);
    for (i = begin + 1; i < end; i++){
        lit l = *i;
        maxvar = lit_var(l) > maxvar ? lit_var(l) : maxvar;
        for (j = i; j > begin && *(j-1) > l; j--)
            *j = *(j-1);
        *j = l;
    }
    sat_solver3_setnvars(s,maxvar+1);

    // delete duplicates
    last = lit_Undef;
    for (i = j = begin; i < end; i++){
        //printf("lit: "L_LIT", value = %d\n", L_lit(*i), (lit_sign(*i) ? -s->assignss[lit_var(*i)] : s->assignss[lit_var(*i)]));
        if (*i == lit_neg(last) || var_value(s, lit_var(*i)) == lit_sign(*i))
            return true;   // tautology
        else if (*i != last && var_value(s, lit_var(*i)) == varX)
            last = *j++ = *i;
    }
//    j = i;

    if (j == begin)          // empty clause
        return false;

    if (j - begin == 1) // unit clause
        return sat_solver3_enqueue(s,*begin,0);

    // create new clause
    sat_solver3_clause_new(s,begin,j,0);
    return true;
}